

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BloomFilter.hpp
# Opt level: O3

void __thiscall
supermap::BloomFilter<supermap::Key<30UL>_>::BloomFilter
          (BloomFilter<supermap::Key<30UL>_> *this,BloomFilter<supermap::Key<30UL>_> *other)

{
  pointer *__ptr;
  
  (this->super_Filter<supermap::Key<30UL>_>).
  super_Cloneable<supermap::Filter<supermap::Key<30UL>_>_>._vptr_Cloneable =
       (_func_int **)&PTR_clone_00126158;
  (**(((other->hasher_)._M_t.
       super___uniq_ptr_impl<supermap::Hasher,_std::default_delete<supermap::Hasher>_>._M_t.
       super__Tuple_impl<0UL,_supermap::Hasher_*,_std::default_delete<supermap::Hasher>_>.
       super__Head_base<0UL,_supermap::Hasher_*,_false>._M_head_impl)->
     super_Cloneable<supermap::Hasher>)._vptr_Cloneable)(&this->hasher_);
  this->sizeMultiplier_ = other->sizeMultiplier_;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->seeds_,&other->seeds_);
  std::vector<bool,_std::allocator<bool>_>::vector(&this->elements_,&other->elements_);
  this->wasReserved_ = other->wasReserved_;
  return;
}

Assistant:

BloomFilter(const BloomFilter &other)
        : hasher_(other.hasher_->clone()),
          sizeMultiplier_(other.sizeMultiplier_),
          seeds_(other.seeds_),
          elements_(other.elements_),
          wasReserved_(other.wasReserved_) {
    }